

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointPolicyPureVectorForClusteredBG.cpp
# Opt level: O0

void __thiscall
JointPolicyPureVectorForClusteredBG::StartRecursiveConstructionPerAgent
          (JointPolicyPureVectorForClusteredBG *this,PlanningUnitDecPOMDPDiscrete *pu,
          JPPV_sharedPtr *jpolJPPV,Index ts,
          vector<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
          *jpolBGVec,
          vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
          *bgVec)

{
  Type *this_00;
  _func_int *p_Var1;
  undefined4 uVar2;
  undefined4 uVar3;
  shared_count sVar4;
  bool bVar5;
  int iVar6;
  SubClass SVar7;
  const_reference ppJVar8;
  undefined4 extraout_var;
  size_t sVar9;
  TypeCluster *pTVar10;
  reference ppTVar11;
  undefined8 uVar12;
  type pJVar13;
  ulong uVar14;
  ulong uVar15;
  uint *puVar16;
  uint auStackY_230 [12];
  PlanningUnitDecPOMDPDiscrete *in_stack_fffffffffffffe08;
  BayesianGameWithClusterInfo *in_stack_fffffffffffffe10;
  uint local_1e8 [4];
  undefined8 local_1d8;
  uint local_1d0 [2];
  char *in_stack_fffffffffffffe38;
  E *in_stack_fffffffffffffe40;
  Type_AOHIndex *local_1a0;
  uint local_198 [27];
  uint auStack_12c [3];
  undefined1 local_120 [28];
  Index aI;
  Index ohI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> observations;
  unsigned_long __vla_expr1;
  unsigned_long __vla_expr0;
  uint auStack_b8 [3];
  Index aohI;
  Type_AOHIndex *t2;
  Type *t1;
  type_ci last;
  type_ci it;
  TypeCluster *tc;
  Index tI;
  uint local_74;
  undefined1 local_70 [4];
  Index agI;
  BGwCI_constPtr bg;
  JointPolicyDiscretePure *jpolBG;
  vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
  *bgVec_local;
  vector<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
  *jpolBGVec_local;
  Index ts_local;
  JPPV_sharedPtr *jpolJPPV_local;
  PlanningUnitDecPOMDPDiscrete *pu_local;
  JointPolicyPureVectorForClusteredBG *this_local;
  
  ppJVar8 = std::
            vector<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
            ::at((vector<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
                  *)in_stack_fffffffffffffe10,(size_type)in_stack_fffffffffffffe08);
  bg.pn.pi_ = (sp_counted_base *)*ppJVar8;
  std::
  vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
  ::at((vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
        *)in_stack_fffffffffffffe10,(size_type)in_stack_fffffffffffffe08);
  boost::shared_ptr<const_BayesianGameWithClusterInfo>::shared_ptr
            ((shared_ptr<const_BayesianGameWithClusterInfo> *)in_stack_fffffffffffffe10,
             (shared_ptr<const_BayesianGameWithClusterInfo> *)in_stack_fffffffffffffe08);
  local_74 = 0;
  do {
    iVar6 = (*(pu->super_PlanningUnitMADPDiscrete).super_PlanningUnit._vptr_PlanningUnit[6])();
    if (CONCAT44(extraout_var,iVar6) <= (ulong)local_74) {
      boost::shared_ptr<const_BayesianGameWithClusterInfo>::~shared_ptr
                ((shared_ptr<const_BayesianGameWithClusterInfo> *)0x8c8c64);
      return;
    }
    tc._0_4_ = 0;
    while( true ) {
      boost::shared_ptr<const_BayesianGameWithClusterInfo>::operator->
                ((shared_ptr<const_BayesianGameWithClusterInfo> *)local_70);
      sVar9 = BayesianGameBase::GetNrTypes
                        ((BayesianGameBase *)in_stack_fffffffffffffe10,
                         (Index)((ulong)in_stack_fffffffffffffe08 >> 0x20));
      if (sVar9 <= (uint)tc) break;
      boost::shared_ptr<const_BayesianGameWithClusterInfo>::operator->
                ((shared_ptr<const_BayesianGameWithClusterInfo> *)local_70);
      pTVar10 = BayesianGameWithClusterInfo::GetTypeCluster
                          (in_stack_fffffffffffffe10,
                           (Index)((ulong)in_stack_fffffffffffffe08 >> 0x20),
                           (Index)in_stack_fffffffffffffe08);
      last = TypeCluster::begin((TypeCluster *)in_stack_fffffffffffffe08);
      t1 = (Type *)TypeCluster::end((TypeCluster *)in_stack_fffffffffffffe08);
      while( true ) {
        bVar5 = std::operator!=(&last,(_Self *)&t1);
        if (!bVar5) break;
        ppTVar11 = std::_Rb_tree_const_iterator<Type_*>::operator*
                             ((_Rb_tree_const_iterator<Type_*> *)0x8c8847);
        this_00 = *ppTVar11;
        SVar7 = Type::GetSubClass(this_00);
        if (SVar7 != AOHINDEX) {
          uVar12 = __cxa_allocate_exception(0x28);
          E::E(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
          __cxa_throw(uVar12,&E::typeinfo,E::~E);
        }
        if (this_00 == (Type *)0x0) {
          local_1a0 = (Type_AOHIndex *)0x0;
        }
        else {
          local_1a0 = (Type_AOHIndex *)
                      __dynamic_cast(this_00,&Type::typeinfo,&Type_AOHIndex::typeinfo,0);
        }
        Type_AOHIndex::GetAOHIndex(local_1a0);
        puVar16 = (uint *)(&stack0xfffffffffffffe08 +
                          (-((long)(ulong)ts * 4 + 0xfU & 0xfffffffffffffff0) -
                          ((ulong)ts * 4 + 0xf & 0xfffffffffffffff0)));
        observations.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)(ulong)ts;
        puVar16[-2] = 0x8c89ba;
        puVar16[-1] = 0;
        PlanningUnitMADPDiscrete::GetActionObservationHistoryArrays
                  (*(PlanningUnitMADPDiscrete **)(puVar16 + 0x1e),puVar16[0x1d],puVar16[0x1c],
                   puVar16[0x1b],*(Index **)(puVar16 + 0x18),*(Index **)(puVar16 + 0x16));
        puVar16[-2] = 0x8c89c8;
        puVar16[-1] = 0;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)(puVar16 + -2));
        if (ts != 0) {
          in_stack_fffffffffffffe38 = (char *)(ulong)*puVar16;
          in_stack_fffffffffffffe40 = (E *)(puVar16 + (ts - 1));
          puVar16[-2] = 0x8c8a05;
          puVar16[-1] = 0;
          std::allocator<unsigned_int>::allocator(*(allocator<unsigned_int> **)(puVar16 + -2));
          puVar16[-2] = 0x8c8a26;
          puVar16[-1] = 0;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)(puVar16 + 10),
                     *(size_type *)(puVar16 + 8),*(value_type_conflict1 **)(puVar16 + 6),
                     *(allocator_type **)(puVar16 + 4));
          puVar16[-2] = 0x8c8a3b;
          puVar16[-1] = 0;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                    (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)(puVar16 + 6),
                     *(vector<unsigned_int,_std::allocator<unsigned_int>_> **)(puVar16 + 4));
          puVar16[-2] = 0x8c8a47;
          puVar16[-1] = 0;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                    (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)(puVar16 + 6));
          puVar16[-2] = 0x8c8a53;
          puVar16[-1] = 0;
          std::allocator<unsigned_int>::~allocator(*(allocator<unsigned_int> **)(puVar16 + -2));
        }
        puVar16[-2] = 0x8c8a88;
        puVar16[-1] = 0;
        local_120._24_4_ =
             PlanningUnitMADPDiscrete::GetObservationHistoryIndex
                       (*(PlanningUnitMADPDiscrete **)(puVar16 + 10),puVar16[9],puVar16[8],
                        *(vector<unsigned_int,_std::allocator<unsigned_int>_> **)(puVar16 + 6));
        sVar4 = bg.pn;
        p_Var1 = (bg.pn.pi_)->_vptr_sp_counted_base[0x13];
        puVar16[-2] = 0x8c8ab2;
        puVar16[-1] = 0;
        local_120._20_4_ = (*p_Var1)(sVar4.pi_,(ulong)local_74,(ulong)(uint)tc);
        puVar16[-2] = 0x8c8ad2;
        puVar16[-1] = 0;
        pJVar13 = boost::shared_ptr<JointPolicyPureVector>::operator->(jpolJPPV);
        uVar15 = (ulong)(uint)local_120._24_4_;
        uVar14 = (ulong)(uint)local_120._20_4_;
        p_Var1 = (pJVar13->super_JointPolicyDiscretePure).super_JointPolicyDiscrete.
                 super_JointPolicy._vptr_JointPolicy[0x10];
        puVar16[-2] = 0x8c8afd;
        puVar16[-1] = 0;
        (*p_Var1)(pJVar13,(ulong)local_74,uVar15,uVar14);
        puVar16[-2] = 0x8c8b14;
        puVar16[-1] = 0;
        sVar9 = PlanningUnit::GetHorizon((PlanningUnit *)pu);
        if (ts + 1 < sVar9) {
          in_stack_fffffffffffffe10 = (BayesianGameWithClusterInfo *)local_120;
          in_stack_fffffffffffffe08 = pu;
          puVar16[-2] = 0x8c8b59;
          puVar16[-1] = 0;
          boost::shared_ptr<JointPolicyPureVector>::shared_ptr
                    (*(shared_ptr<JointPolicyPureVector> **)(puVar16 + 2),
                     *(shared_ptr<JointPolicyPureVector> **)puVar16);
          uVar3 = local_120._24_4_;
          uVar2 = local_120._20_4_;
          *(vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
            **)(puVar16 + -2) = bgVec;
          *(vector<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
            **)(puVar16 + -4) = jpolBGVec;
          puVar16[-6] = uVar2;
          puVar16[-8] = (uint)tc;
          *(TypeCluster **)(puVar16 + -10) = pTVar10;
          puVar16[-0xc] = uVar3;
          puVar16[-0xe] = 0x8c8bc1;
          puVar16[-0xd] = 0;
          RecursivelyFillPolicyForAgent
                    (*(JointPolicyPureVectorForClusteredBG **)(puVar16 + 0x3a),
                     *(PlanningUnitDecPOMDPDiscrete **)(puVar16 + 0x38),
                     *(JPPV_sharedPtr **)(puVar16 + 0x36),puVar16[0x35],puVar16[0x34],puVar16[0x33],
                     puVar16[0x46],*(TypeCluster **)(puVar16 + 0x48),puVar16[0x4a],puVar16[0x4c],
                     *(vector<const_JointPolicyDiscretePure_*,_std::allocator<const_JointPolicyDiscretePure_*>_>
                       **)(puVar16 + 0x4e),
                     *(vector<boost::shared_ptr<const_BayesianGameWithClusterInfo>,_std::allocator<boost::shared_ptr<const_BayesianGameWithClusterInfo>_>_>
                       **)(puVar16 + 0x50));
          puVar16[-2] = 0x8c8bd3;
          puVar16[-1] = 0;
          boost::shared_ptr<JointPolicyPureVector>::~shared_ptr
                    (*(shared_ptr<JointPolicyPureVector> **)(puVar16 + -2));
        }
        puVar16[-2] = 0x8c8c0b;
        puVar16[-1] = 0;
        std::_Rb_tree_const_iterator<Type_*>::operator++
                  (*(_Rb_tree_const_iterator<Type_*> **)(puVar16 + 4),puVar16[3]);
        puVar16[-2] = 0x8c8c1e;
        puVar16[-1] = 0;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)(puVar16 + 6));
      }
      tc._0_4_ = (uint)tc + 1;
    }
    local_74 = local_74 + 1;
  } while( true );
}

Assistant:

void 
JointPolicyPureVectorForClusteredBG::StartRecursiveConstructionPerAgent( 
        const PlanningUnitDecPOMDPDiscrete* pu,
        JPPV_sharedPtr jpolJPPV,
        Index ts,
        const vector<const JointPolicyDiscretePure*> & jpolBGVec,
        const vector<boost::shared_ptr<const BayesianGameWithClusterInfo> >& bgVec
        ) const 
{
    const JointPolicyDiscretePure* jpolBG = jpolBGVec.at(ts);
#if DEBUG_TOJPPV
    cout << ">>>StartRecursiveConstructionPerAgent jpolBG is "
         << jpolBG->SoftPrint() << endl;
#endif
    BGwCI_constPtr bg = bgVec.at(ts);
    for(Index agI=0; agI < pu->GetNrAgents(); agI++)
    {
        for(Index tI=0; tI < bg->GetNrTypes(agI); tI++)
        {
            const TypeCluster* tc =  bg->GetTypeCluster(agI, tI);
            TypeCluster::type_ci it = tc->begin();
            TypeCluster::type_ci last = tc->end();
            while(it != last)
            {
                Type* t1 = *it;
                if(t1->GetSubClass() != Type::AOHINDEX)
                    throw E("JointPolicyPureVectorForClusteredBG::StartRecursiveConstructionPerAgent - expected an AOHINDEX type");
                Type_AOHIndex* t2 = dynamic_cast<Type_AOHIndex*>(t1);
                Index aohI = t2->GetAOHIndex();
                Index aIs[ts];
                Index oIs[ts];
                pu->GetActionObservationHistoryArrays (
                        agI, aohI, ts, aIs, oIs );
                vector<Index> observations;
                if(ts > 0)
                    observations = vector<Index>(oIs[0], oIs[ts-1]);
                Index ohI = pu->GetObservationHistoryIndex ( 
                        agI, ts, observations);
                Index aI = jpolBG->GetActionIndex(agI, tI);
                jpolJPPV->SetAction(agI, ohI, aI);
                
                if(ts+1 < pu->GetHorizon())
                    RecursivelyFillPolicyForAgent(
                        pu, jpolJPPV, agI, ts+1, aohI, ohI, tc, tI, aI, jpolBGVec, bgVec);
                it++;
            }
            
        }
    }

}